

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O0

void __thiscall
PolygonTriangulation::thread_endpoints
          (PolygonTriangulation *this,uint32_t segment_index,uint32_t max_y_index,
          uint32_t min_y_index)

{
  bool bVar1;
  uint32_t trapezoid_index;
  uint32_t key_index;
  reference ppQVar2;
  reference trapezoid;
  reference trapezoid_00;
  reference pvVar3;
  QNode_t *right_fusion_node;
  QNode_t *new_sink;
  value_type *above_trapezoid;
  value_type *new_trapezoid;
  value_type *top_trapezoid;
  uint32_t new_trapezoid_index;
  uint32_t top_trapezoid_index;
  vertex_t v;
  uint32_t min_y_index_local;
  uint32_t max_y_index_local;
  uint32_t segment_index_local;
  PolygonTriangulation *this_local;
  
  v.y._4_4_ = min_y_index;
  compute_offset_vertex(this,max_y_index,min_y_index,(vertex_t *)&new_trapezoid_index);
  ppQVar2 = std::
            vector<PolygonTriangulation::QNode_t_*,_std::allocator<PolygonTriangulation::QNode_t_*>_>
            ::operator[](&this->vertex_ynodes_,(ulong)max_y_index);
  trapezoid_index = search_trapezoid_index(this,(vertex_t *)&new_trapezoid_index,*ppQVar2);
  key_index = get_new_trapezoid_index(this);
  trapezoid = std::
              vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
              ::operator[](&this->trapezoids_,(ulong)trapezoid_index);
  trapezoid_00 = std::
                 vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
                 ::operator[](&this->trapezoids_,(ulong)key_index);
  memcpy(trapezoid_00,trapezoid,0x28);
  if (trapezoid->above2 == 0xffffffff) {
    pvVar3 = std::
             vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ::operator[](&this->trapezoids_,(ulong)trapezoid->above1);
    if (pvVar3->below2 == 0xffffffff) {
      pvVar3->below2 = key_index;
    }
    else if ((trapezoid_index == pvVar3->below2) && (trapezoid->left_segment != 0xffffffff)) {
      pvVar3->below2 = key_index;
    }
  }
  else {
    pvVar3 = std::
             vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ::operator[](&this->trapezoids_,(ulong)trapezoid->above2);
    pvVar3->below1 = key_index;
    trapezoid_00->above1 = trapezoid->above2;
  }
  trapezoid->above2 = 0xffffffff;
  trapezoid_00->above2 = 0xffffffff;
  right_fusion_node = create_node(this,SINK,this->root_,key_index);
  split_merge_trapezoids
            (this,segment_index,v.y._4_4_,trapezoid_index,(QNode_t *)0x0,right_fusion_node);
  bVar1 = is_top_triangle(this,trapezoid);
  if (bVar1) {
    trapezoid->above1 = 0xffffffff;
  }
  else {
    bVar1 = is_top_triangle(this,trapezoid_00);
    if (bVar1) {
      trapezoid_00->above1 = 0xffffffff;
    }
  }
  return;
}

Assistant:

void PolygonTriangulation::thread_endpoints(
    const uint32_t segment_index,
    const uint32_t max_y_index,
    const uint32_t min_y_index
) {
  // Recursively split and merge trapezoids intersecting the segment.

  // To find the top trapezoid we need to offset the first vertex in the direction
  // of the segment, to distinct between left/right trapezoids neighbors.
  vertex_t v;
  compute_offset_vertex(max_y_index, min_y_index, v);

  /// @note could be constant instead, by storing two below sinks and a segment for each Y.
  /// furthermore this will prevent a bug when trapzeoid collapse (on same Ys).
  const auto top_trapezoid_index = search_trapezoid_index(v, vertex_ynodes_[max_y_index]); //
  const auto new_trapezoid_index = get_new_trapezoid_index();

  auto &top_trapezoid = trapezoids_[top_trapezoid_index];
  auto &new_trapezoid = trapezoids_[new_trapezoid_index];

  // Copy top trapezoid attributes to the new one.
  new_trapezoid = top_trapezoid;

  // Link first splitted trapezoid to the one above it.
  if (kInvalidIndex != top_trapezoid.above2) {
    trapezoids_[top_trapezoid.above2].below1 = new_trapezoid_index;
    new_trapezoid.above1 = top_trapezoid.above2;
  } else {
    auto &above_trapezoid = trapezoids_[top_trapezoid.above1];

    if (above_trapezoid.below2 == kInvalidIndex) {
      // case 1 : new empty trapezoid
      above_trapezoid.below2 = new_trapezoid_index;
    } else if (   (top_trapezoid_index == above_trapezoid.below2)
               && (kInvalidIndex != top_trapezoid.left_segment)) {
      // case 2 : old right trap will become a triangle
      above_trapezoid.below2 = new_trapezoid_index;
    }
  }
  top_trapezoid.above2 = kInvalidIndex;
  new_trapezoid.above2 = kInvalidIndex;

  // Every threading operation create one new sink, used as the right fusion sink
  // by default.
  auto *new_sink = create_node(SINK, root_, new_trapezoid_index);

#if DEBUG_INFO
  fprintf(stderr, "> split X : %d %d\n", max_y_index, min_y_index);
#endif
  split_merge_trapezoids(segment_index, min_y_index, top_trapezoid_index, nullptr, new_sink);

  // Close connections with above trapezoid when one of the start trapezoids
  // (left or right) is a triangle.
  if (is_top_triangle(top_trapezoid)) {
    top_trapezoid.above1 = kInvalidIndex;
  } else if (is_top_triangle(new_trapezoid)) {
    new_trapezoid.above1 = kInvalidIndex;
  }
}